

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ShapeFunctions
          (ChElementHexaANCF_3813_9 *this,ShapeVector *N,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [32];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  
  auVar15._8_8_ = x;
  auVar15._0_8_ = x;
  dVar1 = (this->m_dimensions).m_data[2];
  auVar7 = vpermi2pd_avx512f(_DAT_00edd9c0,ZEXT864((ulong)(1.0 - z)),
                             ZEXT1664(CONCAT88(z + 1.0,z + 1.0)));
  auVar17._8_8_ = 0x3fc0000000000000;
  auVar17._0_8_ = 0x3fc0000000000000;
  auVar12._8_8_ = y;
  auVar12._0_8_ = y;
  auVar3 = vpermpd_avx2(ZEXT1632(CONCAT88(x + 1.0,1.0 - x)),0x24);
  dVar2 = y + 1.0;
  auVar10 = vunpcklpd_avx(auVar15,auVar12);
  dVar4 = (this->m_dimensions).m_data[0];
  dVar5 = (this->m_dimensions).m_data[1];
  auVar16._8_8_ = dVar2;
  auVar16._0_8_ = dVar2;
  auVar16._16_8_ = dVar2;
  auVar16._24_8_ = dVar2;
  auVar6._0_8_ = auVar3._0_8_ * 0.125;
  auVar6._8_8_ = auVar3._8_8_ * 0.125;
  auVar6._16_8_ = auVar3._16_8_ * 0.125;
  auVar6._24_8_ = auVar3._24_8_ * 0.125;
  auVar3 = vblendpd_avx(auVar6,auVar16,4);
  auVar6 = vpermi2pd_avx512vl(_DAT_00ec4840,ZEXT832((ulong)(1.0 - y)),auVar3);
  auVar11._0_8_ = auVar6._0_8_ * auVar3._0_8_;
  auVar11._8_8_ = auVar6._8_8_ * auVar3._8_8_;
  auVar11._16_8_ = auVar6._16_8_ * auVar3._16_8_;
  auVar11._24_8_ = auVar6._24_8_ * auVar3._24_8_;
  auVar8 = vinsertf64x4_avx512f(ZEXT3264(auVar11),auVar11,1);
  auVar7 = vmulpd_avx512f(auVar8,auVar7);
  *(undefined1 (*) [64])
   (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array =
       auVar7;
  auVar9._0_8_ = dVar4 * dVar4;
  auVar9._8_8_ = dVar5 * dVar5;
  auVar13._0_8_ = auVar10._0_8_ * auVar10._0_8_ * auVar9._0_8_ * 0.125;
  auVar13._8_8_ = auVar10._8_8_ * auVar10._8_8_ * auVar9._8_8_ * 0.125;
  auVar10 = vfnmadd231pd_fma(auVar13,auVar9,auVar17);
  dVar1 = dVar1 * dVar1;
  *(undefined1 (*) [16])
   ((N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array + 8)
       = auVar10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = z * z * dVar1 * 0.125;
  auVar10 = vfmadd231sd_fma(auVar14,auVar10,ZEXT816(0xbfc0000000000000));
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[10] =
       auVar10._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ShapeFunctions(ShapeVector& N, double x, double y, double z) {
    double a = GetDimensions().x();
    double b = GetDimensions().y();
    double c = GetDimensions().z();
    N(0) = 0.125 * (1 - x) * (1 - y) * (1 - z);
    N(1) = 0.125 * (1 + x) * (1 - y) * (1 - z);
    N(2) = 0.125 * (1 + x) * (1 + y) * (1 - z);
    N(3) = 0.125 * (1 - x) * (1 + y) * (1 - z);
    N(4) = 0.125 * (1 - x) * (1 - y) * (1 + z);
    N(5) = 0.125 * (1 + x) * (1 - y) * (1 + z);
    N(6) = 0.125 * (1 + x) * (1 + y) * (1 + z);
    N(7) = 0.125 * (1 - x) * (1 + y) * (1 + z);
    N(8) = (a * a) * (-1.0 / 8.0) + (a * a) * (x * x) * (1.0 / 8.0);
    N(9) = (b * b) * (-1.0 / 8.0) + (b * b) * (y * y) * (1.0 / 8.0);
    N(10) = (c * c) * (-1.0 / 8.0) + (c * c) * (z * z) * (1.0 / 8.0);
}